

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_PhaseCalcIncrement(opm_t *chip)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint local_4c;
  uint32_t inc;
  uint32_t sum_l;
  uint32_t sum_h;
  uint32_t sum;
  uint32_t note;
  uint32_t basefreq;
  uint32_t block;
  uint32_t fnum;
  uint32_t kcode;
  uint32_t multi;
  uint32_t detune;
  uint32_t dt_l;
  uint32_t dt;
  uint32_t channel;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar2 = chip->cycles;
  bVar1 = chip->sl_dt1[uVar2];
  kcode = 0;
  block = (uint32_t)chip->pg_kcode[uVar2];
  if ((bVar1 & 3) != 0) {
    if (0x1c < block) {
      block = 0x1c;
    }
    uVar3 = (block >> 2) + 9 + ((uint)((bVar1 & 3) == 3) | bVar1 & 2);
    kcode = pg_detune[(uVar3 & 1) << 2 | block & 3] >> (9U - (char)(uVar3 >> 1) & 0x1f);
  }
  if ((bVar1 & 4) != 0) {
    kcode = -kcode;
  }
  sum = (((uint)chip->pg_fnum[uVar2] << (chip->pg_kcode[uVar2] >> 2 & 0x1f)) >> 2) + kcode;
  if (chip->sl_mul[uVar2] == 0) {
    local_4c = (sum & 0x1ffff) >> 1;
  }
  else {
    local_4c = (sum & 0x1ffff) * (uint)chip->sl_mul[uVar2];
  }
  chip->pg_inc[uVar2] = local_4c & 0xfffff;
  return;
}

Assistant:

static void OPM_PhaseCalcIncrement(opm_t *chip)
{
    uint32_t slot = chip->cycles;
    uint32_t channel = slot % 8;
    uint32_t dt = chip->sl_dt1[slot];
    uint32_t dt_l = dt & 3;
    uint32_t detune = 0;
    uint32_t multi = chip->sl_mul[slot];
    uint32_t kcode = chip->pg_kcode[slot];
    uint32_t fnum = chip->pg_fnum[slot];
    uint32_t block = kcode >> 2;
    uint32_t basefreq = (fnum << block) >> 2;
    uint32_t note, sum, sum_h, sum_l, inc;
    /* Apply detune */
    if (dt_l)
    {
        if (kcode > 0x1c)
        {
            kcode = 0x1c;
        }
        block = kcode >> 2;
        note = kcode & 0x03;
        sum = block + 9 + ((dt_l == 3) | (dt_l & 0x02));
        sum_h = sum >> 1;
        sum_l = sum & 0x01;
        detune = pg_detune[(sum_l << 2) | note] >> (9 - sum_h);
    }
    if (dt & 0x04)
    {
        basefreq -= detune;
    }
    else
    {
        basefreq += detune;
    }
    basefreq &= 0x1ffff;
    if (multi)
    {
        inc = basefreq * multi;
    }
    else
    {
        inc = basefreq >> 1;
    }
    inc &= 0xfffff;
    chip->pg_inc[slot] = inc;
}